

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FArchive *arc,SDWORD *vars,int max)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  DWORD DVar4;
  ulong uVar5;
  DWORD *w;
  int iVar6;
  int iVar7;
  SDWORD arcval;
  DWORD local_3c;
  DWORD local_38;
  DWORD local_34;
  
  if (arc->m_Storing == true) {
    uVar2 = 0;
    uVar5 = 0;
    if (0 < max) {
      uVar5 = (ulong)(uint)max;
    }
    for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      if (vars[uVar2] != 0) {
        uVar5 = uVar2 & 0xffffffff;
        break;
      }
    }
    lVar3 = (long)max;
    DVar4 = (DWORD)uVar5;
    iVar7 = max + 1;
    do {
      iVar6 = iVar7;
      if (lVar3 <= (int)DVar4) goto LAB_00479fb6;
      iVar7 = iVar6 + -1;
      lVar1 = lVar3 + -1;
      lVar3 = lVar3 + -1;
    } while (vars[lVar1] == 0);
    if ((int)DVar4 < iVar7) {
      local_34 = iVar7 - DVar4;
      FArchive::operator<<(arc,&local_34);
      local_34 = DVar4;
      FArchive::operator<<(arc,&local_34);
      w = (DWORD *)(vars + (int)DVar4);
      for (; (int)uVar5 <= iVar6 + -2; uVar5 = (ulong)((int)uVar5 + 1)) {
        FArchive::operator<<(arc,w);
        w = w + 1;
      }
    }
    else {
LAB_00479fb6:
      local_34 = 0;
      FArchive::operator<<(arc,&local_34);
    }
  }
  else {
    memset(vars,0,(long)max << 2);
    FArchive::operator<<(arc,&local_38);
    if (local_38 != 0) {
      FArchive::operator<<(arc,&local_3c);
      DVar4 = local_38 + local_3c;
      local_38 = max;
      if ((int)DVar4 < max) {
        local_38 = DVar4;
      }
      for (; (int)local_3c < (int)local_38; local_3c = local_3c + 1) {
        FArchive::operator<<(arc,(DWORD *)(vars + (int)local_3c));
      }
      for (; (int)local_3c < (int)DVar4; local_3c = local_3c + 1) {
        FArchive::operator<<(arc,&local_34);
      }
    }
  }
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FArchive &arc, SDWORD *vars, int max)
{
	SDWORD arcval;
	SDWORD first, last;

	if (arc.IsStoring ())
	{
		// Find first non-zero variable
		for (first = 0; first < max; ++first)
		{
			if (vars[first] != 0)
			{
				break;
			}
		}

		// Find last non-zero variable
		for (last = max - 1; last >= first; --last)
		{
			if (vars[last] != 0)
			{
				break;
			}
		}

		if (last < first)
		{ // no non-zero variables
			arcval = 0;
			arc << arcval;
			return;
		}

		arcval = last - first + 1;
		arc << arcval;
		arcval = first;
		arc << arcval;

		while (first <= last)
		{
			arc << vars[first];
			++first;
		}
	}
	else
	{
		SDWORD truelast;

		memset (vars, 0, max*sizeof(*vars));

		arc << last;
		if (last == 0)
		{
			return;
		}
		arc << first;
		last += first;
		truelast = last;

		if (last > max)
		{
			last = max;
		}

		while (first < last)
		{
			arc << vars[first];
			++first;
		}
		while (first < truelast)
		{
			arc << arcval;
			++first;
		}
	}
}